

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_next(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  SQObjectPtr *in_RSI;
  SQOuter *in_RDI;
  int in_stack_00000010;
  int *in_stack_00000018;
  int faketojump;
  SQObjectPtr val;
  SQObjectPtr realkey;
  SQObjectPtr *refpos;
  SQObjectPtr o;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff6c;
  SQVM *in_stack_ffffffffffffff70;
  undefined1 local_68 [24];
  SQObjectPtr local_50 [2];
  SQObjectType in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  SQObjectValue in_stack_ffffffffffffffe0;
  SQVM *in_stack_fffffffffffffff8;
  
  pSVar2 = stack_get(in_stack_ffffffffffffff70,
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffd8,pSVar2);
  pSVar2 = stack_get(in_stack_ffffffffffffff70,
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  SQObjectPtr::SQObjectPtr(local_50);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_68 + 8));
  if (in_stack_ffffffffffffffd8 == OT_GENERATOR) {
    SVar3 = sq_throwerror(in_stack_ffffffffffffff70,
                          (SQChar *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  else {
    in_stack_ffffffffffffff70 = (SQVM *)local_68;
    uVar4 = 0x29a;
    bVar1 = SQVM::FOREACH_OP(in_stack_fffffffffffffff8,(SQObjectPtr *)in_RDI,in_RSI,
                             (SQObjectPtr *)in_stack_ffffffffffffffe0.pTable,
                             (SQObjectPtr *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             (SQInteger)pSVar2,in_stack_00000010,in_stack_00000018);
    if (bVar1) {
      if (local_68._0_4_ == 0x29a) {
        SVar3 = -1;
      }
      else {
        SQVM::Push(in_stack_ffffffffffffff70,
                   (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff6c,uVar4));
        SQVM::Push(in_stack_ffffffffffffff70,
                   (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff6c,uVar4));
        SVar3 = 0;
      }
    }
    else {
      SVar3 = -1;
    }
  }
  local_68._4_4_ = 1;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff70);
  return SVar3;
}

Assistant:

SQRESULT sq_next(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr o=stack_get(v,idx),&refpos = stack_get(v,-1),realkey,val;
    if(sq_type(o) == OT_GENERATOR) {
        return sq_throwerror(v,_SC("cannot iterate a generator"));
    }
    int faketojump;
    if(!v->FOREACH_OP(o,realkey,val,refpos,0,666,faketojump))
        return SQ_ERROR;
    if(faketojump != 666) {
        v->Push(realkey);
        v->Push(val);
        return SQ_OK;
    }
    return SQ_ERROR;
}